

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O3

string * get_graph_by_percentage_abi_cxx11_(string *__return_storage_ptr__,uint value,uint len)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar3 = (ulong)((float)len * ((float)value / 99.9));
  uVar2 = (uint)uVar3;
  if (uVar2 != 0) {
    uVar3 = uVar3 & 0xffffffff;
    do {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      uVar4 = (int)uVar3 - 1;
      uVar3 = (ulong)uVar4;
    } while (uVar4 != 0);
  }
  iVar1 = len - uVar2;
  if (uVar2 <= len && iVar1 != 0) {
    do {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_graph_by_percentage( unsigned value, unsigned len )
{
  unsigned step = 0;
  std::string bars;

  unsigned bar_count = ( static_cast<float>(value) / 99.9 * len );

  for( ; step < bar_count; step++ )
  {
    bars.append( "|" );
  }
  for( ; step < len; step++ )
  {
    bars.append( " " );
  }

  return bars;
}